

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O2

Side banksia::string2Side(string *s)

{
  bool bVar1;
  Side SVar2;
  Side SVar3;
  long lVar4;
  
  toLower(s);
  lVar4 = 0;
  SVar3 = black;
  while (((SVar2 = none, *(char **)((long)&sideStrings + lVar4) != (char *)0x0 &&
          (bVar1 = std::operator==(*(char **)((long)&sideStrings + lVar4),s), SVar2 = SVar3, !bVar1)
          ) && (bVar1 = std::operator==(*(char **)((long)&shortSideStrings + lVar4),s), !bVar1))) {
    SVar3 = SVar3 + white;
    lVar4 = lVar4 + 8;
  }
  return SVar2;
}

Assistant:

Side string2Side(std::string s)
    {
        toLower(s);
        for(int i = 0; sideStrings[i]; i++) {
            if (sideStrings[i] == s || shortSideStrings[i] == s) {
                return static_cast<Side>(i);
            }
        }
        return Side::none;

    }